

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_server_test.cc
# Opt level: O1

void __thiscall
xLearn::KVStoreTest_GetServerId_Test::~KVStoreTest_GetServerId_Test
          (KVStoreTest_GetServerId_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(KVStoreTest, GetServerId) {
  KVStore store;
  store.Initialize(3);
  EXPECT_EQ(store.GetServerId((index_t)0), (size_t)0);
  EXPECT_EQ(store.GetServerId((index_t)1), (size_t)1);
  EXPECT_EQ(store.GetServerId((index_t)2), (size_t)2);
  EXPECT_EQ(store.GetServerId((index_t)3), (size_t)0);
  EXPECT_EQ(store.GetServerId((index_t)4), (size_t)1);
  EXPECT_EQ(store.GetServerId((index_t)5), (size_t)2);
  EXPECT_EQ(store.GetServerId((index_t)6), (size_t)0);
  EXPECT_EQ(store.GetServerId((index_t)7), (size_t)1);
  EXPECT_EQ(store.GetServerId((index_t)8), (size_t)2);
  EXPECT_EQ(store.GetServerId((index_t)9), (size_t)0);
}